

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O1

bool comparesEqual(QTimeZone *lhs,QTimeZone *rhs)

{
  QTimeZonePrivate *pQVar1;
  QTimeZonePrivate *other;
  bool bVar2;
  
  pQVar1 = (rhs->d).d;
  if (((ulong)(lhs->d).d & 3) != 0) {
    return (lhs->d).d == pQVar1 && ((ulong)pQVar1 & 3) != 0;
  }
  if (((ulong)pQVar1 & 3) == 0) {
    pQVar1 = (lhs->d).d;
    other = (rhs->d).d;
    if (pQVar1 == other) {
      return true;
    }
    if (other != (QTimeZonePrivate *)0x0 && pQVar1 != (QTimeZonePrivate *)0x0) {
      bVar2 = QTimeZonePrivate::operator==(pQVar1,other);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool comparesEqual(const QTimeZone &lhs, const QTimeZone &rhs) noexcept
{
    if (lhs.d.isShort())
        return rhs.d.isShort() && lhs.d.s == rhs.d.s;

    if (!rhs.d.isShort()) {
        if (lhs.d.d == rhs.d.d)
            return true;
#if QT_CONFIG(timezone)
        return lhs.d.d && rhs.d.d && *lhs.d.d == *rhs.d.d;
#endif
    }

    return false;
}